

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O2

ssize_t __thiscall
TasGrid::TasmanianSparseGrid::write(TasmanianSparseGrid *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  allocator<char> local_269;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ofstream ofs;
  int aiStack_208 [120];
  
  ::std::ofstream::ofstream(&ofs);
  ::std::ofstream::open((char *)&ofs,__fd);
  if (*(int *)((long)aiStack_208 + *(long *)(_ofs + -0x18)) == 0) {
    write(this,(int)&ofs,(void *)((ulong)__buf & 0xff),__n);
    ::std::ofstream::close();
    sVar1 = ::std::ofstream::~ofstream(&ofs);
    return sVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"ERROR: occurred when trying to write to file: ",&local_269);
  ::std::operator+(&local_248,&local_268,(char *)CONCAT44(in_register_00000034,__fd));
  ::std::runtime_error::runtime_error(this_00,(string *)&local_248);
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void TasmanianSparseGrid::write(const char *filename, bool binary) const{
    std::ofstream ofs;
    if (binary == mode_binary){
        ofs.open(filename, std::ios::out | std::ios::binary);
    }else{
        ofs.open(filename);
    }
    if (!ofs.good()) throw std::runtime_error(std::string("ERROR: occurred when trying to write to file: ") + filename);
    write(ofs, binary);
    ofs.close();
}